

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

QItemSelection *
mergeIndexes(QItemSelection *__return_storage_ptr__,QList<QPersistentModelIndex> *indexes)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  QPersistentModelIndex *this;
  long lVar9;
  QPersistentModelIndex *this_00;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  QItemSelection *rowSpans;
  QPersistentModelIndex br;
  ulong local_130;
  ulong local_120;
  undefined8 local_108;
  undefined1 local_100 [16];
  QPersistentModelIndex local_f0;
  undefined1 local_e8 [16];
  QItemSelectionRange local_d8;
  QAbstractItemModel *local_c8;
  QModelIndex local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QModelIndex local_78;
  undefined1 local_58 [16];
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  if ((indexes->d).size != 0) {
    lVar9 = 0;
    uVar7 = 0;
    do {
      this = (indexes->d).ptr + lVar9;
      bVar2 = QPersistentModelIndex::isValid(this);
      if (bVar2) {
        local_f0.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::QPersistentModelIndex(&local_f0,this);
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent(&local_78,&local_f0);
        iVar3 = QPersistentModelIndex::row(&local_f0);
        iVar4 = QPersistentModelIndex::column(&local_f0);
        uVar7 = (ulong)(int)uVar7;
        lVar9 = uVar7 * 8;
        do {
          uVar7 = uVar7 + 1;
          if ((indexes->d).size <= (long)uVar7) break;
          this_00 = (QPersistentModelIndex *)((long)&(indexes->d).ptr[1].d + lVar9);
          bVar2 = QPersistentModelIndex::isValid(this_00);
          if (bVar2) {
            local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_98 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
            uStack_90 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
            QPersistentModelIndex::parent((QModelIndex *)&local_98,this_00);
            iVar5 = QPersistentModelIndex::row(this_00);
            iVar6 = QPersistentModelIndex::column(this_00);
            auVar14[0] = -((char)local_78.m.ptr == (char)local_88.ptr);
            auVar14[1] = -((char)((ulong)local_78.m.ptr >> 8) == (char)((ulong)local_88.ptr >> 8));
            auVar14[2] = -((char)((ulong)local_78.m.ptr >> 0x10) ==
                          (char)((ulong)local_88.ptr >> 0x10));
            auVar14[3] = -((char)((ulong)local_78.m.ptr >> 0x18) ==
                          (char)((ulong)local_88.ptr >> 0x18));
            auVar14[4] = -((char)((ulong)local_78.m.ptr >> 0x20) ==
                          (char)((ulong)local_88.ptr >> 0x20));
            auVar14[5] = -((char)((ulong)local_78.m.ptr >> 0x28) ==
                          (char)((ulong)local_88.ptr >> 0x28));
            auVar14[6] = -((char)((ulong)local_78.m.ptr >> 0x30) ==
                          (char)((ulong)local_88.ptr >> 0x30));
            auVar14[7] = -((char)((ulong)local_78.m.ptr >> 0x38) ==
                          (char)((ulong)local_88.ptr >> 0x38));
            auVar14[8] = 0xff;
            auVar14[9] = 0xff;
            auVar14[10] = 0xff;
            auVar14[0xb] = 0xff;
            auVar14[0xc] = 0xff;
            auVar14[0xd] = 0xff;
            auVar14[0xe] = 0xff;
            auVar14[0xf] = 0xff;
            auVar13[0] = -((char)local_98 == (char)local_78.r);
            auVar13[1] = -(local_98._1_1_ == local_78.r._1_1_);
            auVar13[2] = -(local_98._2_1_ == local_78.r._2_1_);
            auVar13[3] = -(local_98._3_1_ == local_78.r._3_1_);
            auVar13[4] = -(local_98._4_1_ == (char)local_78.c);
            auVar13[5] = -(local_98._5_1_ == local_78.c._1_1_);
            auVar13[6] = -(local_98._6_1_ == local_78.c._2_1_);
            auVar13[7] = -(local_98._7_1_ == local_78.c._3_1_);
            auVar13[8] = -((char)uStack_90 == (char)local_78.i);
            auVar13[9] = -(uStack_90._1_1_ == local_78.i._1_1_);
            auVar13[10] = -(uStack_90._2_1_ == local_78.i._2_1_);
            auVar13[0xb] = -(uStack_90._3_1_ == local_78.i._3_1_);
            auVar13[0xc] = -(uStack_90._4_1_ == local_78.i._4_1_);
            auVar13[0xd] = -(uStack_90._5_1_ == local_78.i._5_1_);
            auVar13[0xe] = -(uStack_90._6_1_ == local_78.i._6_1_);
            auVar13[0xf] = -(uStack_90._7_1_ == local_78.i._7_1_);
            auVar13 = auVar13 & auVar14;
            bVar12 = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff;
            bVar2 = iVar4 + 1 != iVar6;
            bVar1 = iVar5 != iVar3;
            if (!bVar2 && (!bVar1 && !bVar12)) {
              QPersistentModelIndex::operator=(&local_f0,this_00);
              local_78.m.ptr = local_88.ptr;
              local_78._0_8_ = local_98;
              local_78.i = (quintptr)uStack_90;
              iVar3 = iVar5;
              iVar4 = iVar6;
            }
            bVar2 = bVar2 || (bVar1 || bVar12);
          }
          else {
            bVar2 = false;
          }
          lVar9 = lVar9 + 8;
        } while (!bVar2);
        QPersistentModelIndex::operator_cast_to_QModelIndex(this);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_f0);
        QItemSelectionRange::QItemSelectionRange(&local_d8,(QModelIndex *)&local_98,&local_b8);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)local_58,local_48,&local_d8);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)local_58);
        QPersistentModelIndex::~QPersistentModelIndex(&local_d8.br);
        QPersistentModelIndex::~QPersistentModelIndex(&local_d8.tl);
        QPersistentModelIndex::~QPersistentModelIndex(&local_f0);
      }
      else {
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      lVar9 = (long)(int)uVar7;
    } while (lVar9 < (indexes->d).size);
  }
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
  if (local_48 != 0) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QPersistentModelIndex *)(local_58._8_8_ + lVar9 * 0x10));
      local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      uStack_90 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&((QItemSelectionRange *)(local_58._8_8_ + lVar9 * 0x10))->br);
      local_120 = local_78._0_8_ & 0xffffffff;
      local_130 = (ulong)local_78._0_8_ >> 0x20;
      lVar9 = lVar8 << 0x20;
      lVar11 = (long)(int)lVar8;
      lVar10 = (long)(int)lVar8 << 4;
      do {
        lVar8 = lVar11;
        lVar9 = lVar9 + 0x100000000;
        lVar11 = lVar8 + 1;
        if (local_48 <= lVar11) break;
        local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QPersistentModelIndex *)
                   ((long)&(((QItemSelectionRange *)(local_58._8_8_ + 0x10))->tl).d + lVar10));
        local_c8 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QPersistentModelIndex *)
                   ((long)&(((QItemSelectionRange *)(local_58._8_8_ + 0x10))->br).d + lVar10));
        if (local_b8.m.ptr == (QAbstractItemModel *)0x0) {
          local_f0.d = (QPersistentModelIndexData *)0xffffffffffffffff;
          local_e8 = (undefined1  [16])0x0;
        }
        else {
          (*((local_b8.m.ptr)->super_QObject)._vptr_QObject[0xd])
                    (&local_f0,local_b8.m.ptr,(QItemSelectionRange *)&local_b8);
        }
        if (local_78.m.ptr == (QAbstractItemModel *)0x0) {
          local_108 = 0xffffffffffffffff;
          local_100 = (undefined1  [16])0x0;
        }
        else {
          (*((local_78.m.ptr)->super_QObject)._vptr_QObject[0xd])
                    (&local_108,local_78.m.ptr,&local_78);
        }
        if ((((((int)local_f0.d == (int)local_108) && (local_f0.d._4_4_ == local_108._4_4_)) &&
             (local_e8._0_8_ == local_100._0_8_)) &&
            ((local_e8._8_8_ == local_100._8_8_ && (local_b8.c == (uint)local_130)))) &&
           ((local_d8.tl.d._4_4_ == local_98._4_4_ &&
            ((local_b8.r == (int)local_120 + 1 && ((int)local_d8.tl.d == (int)local_98 + 1)))))) {
          local_88.ptr = local_c8;
          local_98 = local_d8.tl.d;
          uStack_90 = local_d8.br.d;
          bVar2 = true;
          local_130 = (ulong)(uint)local_b8.c;
          local_120 = local_b8._0_8_ & 0xffffffff;
        }
        else {
          bVar2 = false;
        }
        lVar10 = lVar10 + 0x10;
      } while (bVar2);
      QItemSelectionRange::QItemSelectionRange
                ((QItemSelectionRange *)&local_b8,&local_78,(QModelIndex *)&local_98);
      QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                ((QMovableArrayOps<QItemSelectionRange> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size,
                 (QItemSelectionRange *)&local_b8);
      QList<QItemSelectionRange>::end(&__return_storage_ptr__->super_QList<QItemSelectionRange>);
      lVar8 = lVar8 + 1;
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8.i);
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8);
      lVar9 = lVar9 >> 0x20;
    } while (lVar9 < local_48);
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
            ((QArrayDataPointer<QItemSelectionRange> *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QItemSelection mergeIndexes(const QList<QPersistentModelIndex> &indexes)
{
    QItemSelection colSpans;
    // merge columns
    int i = 0;
    while (i < indexes.size()) {
        const QPersistentModelIndex &tl = indexes.at(i);
        if (!tl.isValid()) {
            ++i;
            continue;
        }
        QPersistentModelIndex br = tl;
        QModelIndex brParent = br.parent();
        int brRow = br.row();
        int brColumn = br.column();
        while (++i < indexes.size()) {
            const QPersistentModelIndex &next = indexes.at(i);
            if (!next.isValid())
                continue;
            const QModelIndex nextParent = next.parent();
            const int nextRow = next.row();
            const int nextColumn = next.column();
            if ((nextParent == brParent)
                 && (nextRow == brRow)
                 && (nextColumn == brColumn + 1)) {
                br = next;
                brParent = nextParent;
                brRow = nextRow;
                brColumn = nextColumn;
            } else {
                break;
            }
        }
        colSpans.append(QItemSelectionRange(tl, br));
    }
    // merge rows
    QItemSelection rowSpans;
    i = 0;
    while (i < colSpans.size()) {
        QModelIndex tl = colSpans.at(i).topLeft();
        QModelIndex br = colSpans.at(i).bottomRight();
        QModelIndex prevTl = tl;
        while (++i < colSpans.size()) {
            QModelIndex nextTl = colSpans.at(i).topLeft();
            QModelIndex nextBr = colSpans.at(i).bottomRight();

            if (nextTl.parent() != tl.parent())
                break; // we can't merge selection ranges from different parents

            if ((nextTl.column() == prevTl.column()) && (nextBr.column() == br.column())
                && (nextTl.row() == prevTl.row() + 1) && (nextBr.row() == br.row() + 1)) {
                br = nextBr;
                prevTl = nextTl;
            } else {
                break;
            }
        }
        rowSpans.append(QItemSelectionRange(tl, br));
    }
    return rowSpans;
}